

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsvectorbase.h
# Opt level: O2

DSVectorBase<double> * __thiscall
soplex::DSVectorBase<double>::operator=(DSVectorBase<double> *this,SVectorBase<double> *vec)

{
  if (&this->super_SVectorBase<double> != vec) {
    (this->super_SVectorBase<double>).memused = 0;
    makeMem(this,vec->memused);
    SVectorBase<double>::operator=(&this->super_SVectorBase<double>,vec);
  }
  return this;
}

Assistant:

DSVectorBase<R>& operator=(const SVectorBase<S>& vec)
   {
      if(this != &vec)
      {
         SVectorBase<R>::clear();
         makeMem(vec.size());
         SVectorBase<R>::operator=(vec);
      }

      return *this;
   }